

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_material_binding_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,MaterialBinding *mb,uint32_t indent)

{
  size_type *psVar1;
  ulong *puVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  ordered_dict<tinyusdz::Relationship> *this_00;
  bool bVar8;
  long *plVar9;
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  size_t idx;
  uint32_t in_R9D;
  long lVar12;
  string coll_name;
  string matb_name;
  string rel_name;
  Relationship *rel;
  stringstream ss;
  string local_2c0;
  _Rb_tree_node_base *local_2a0;
  string local_298;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Relationship *local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  string *local_1f0;
  _Rb_tree_node_base *local_1e8;
  ordered_dict<tinyusdz::Relationship> *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this == (tinyusdz *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_1f0 = __return_storage_ptr__;
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    local_2a0 = (_Rb_tree_node_base *)this;
    if (*this == (tinyusdz)0x1) {
      local_278 = (undefined1 *)CONCAT44(local_278._4_4_,*(undefined4 *)(this + 0xf8));
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"material:binding","");
      anon_unknown_173::print_relationship
                (&local_298,(Relationship *)(this + 8),(ListEditQual *)&local_278,
                 SUB81(&local_2c0,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(char *)&local_2a0[0x18]._M_left == '\x01') {
      p_Var10 = local_2a0 + 0x18;
      local_278 = (undefined1 *)CONCAT44(local_278._4_4_,*(undefined4 *)&local_2a0[0x20]._M_parent);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,"material:binding:preview","");
      anon_unknown_173::print_relationship
                (&local_298,(Relationship *)&p_Var10->_M_right,(ListEditQual *)&local_278,
                 SUB81(&local_2c0,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)local_2a0[0x31]._M_color == _S_black) {
      p_Var10 = local_2a0 + 0x31;
      local_278 = (undefined1 *)CONCAT44(local_278._4_4_,*(undefined4 *)&local_2a0[0x38]._M_right);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,"material:binding:full","");
      anon_unknown_173::print_relationship
                (&local_298,(Relationship *)&p_Var10->_M_parent,(ListEditQual *)&local_278,
                 SUB81(&local_2c0,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var10 = local_2a0[0x4a]._M_parent;
    p_Var7 = local_2a0 + 0x49;
    if (p_Var10 != (_Rb_tree_node_base *)&p_Var7->_M_right) {
      paVar4 = &local_2c0.field_2;
      do {
        if (p_Var10[1]._M_parent != (_Base_ptr)0x0) {
          local_278 = &local_268;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,":","");
          plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x42e1ea)
          ;
          psVar1 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_2c0.field_2._M_allocated_capacity = *psVar1;
            local_2c0.field_2._8_8_ = plVar9[3];
            local_2c0._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *psVar1;
            local_2c0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2c0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar1;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)::std::__cxx11::string::_M_append
                                     ((char *)&local_2c0,*(ulong *)(p_Var10 + 1));
          puVar2 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar2) {
            local_298.field_2._M_allocated_capacity = *puVar2;
            local_298.field_2._8_8_ = plVar9[3];
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          }
          else {
            local_298.field_2._M_allocated_capacity = *puVar2;
            local_298._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_298._M_string_length = plVar9[1];
          *plVar9 = (long)puVar2;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != paVar4) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if (local_278 != &local_268) {
            operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
          }
          local_278 = (undefined1 *)CONCAT44(local_278._4_4_,*(undefined4 *)&p_Var10[9]._M_left);
          anon_unknown_173::print_relationship
                    (&local_2c0,(Relationship *)(p_Var10 + 2),(ListEditQual *)&local_278,
                     SUB81(&local_298,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != paVar4) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)&p_Var7->_M_right);
    }
    p_Var10 = local_2a0[0x4b]._M_right;
    if (p_Var10 != (_Rb_tree_node_base *)&local_2a0[0x4b]._M_parent) {
      local_2a0 = (_Rb_tree_node_base *)&local_2a0[0x4b]._M_parent;
      do {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        local_298._M_string_length = 0;
        local_298.field_2._M_allocated_capacity =
             local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (p_Var10[1]._M_parent != (_Base_ptr)0x0) {
          local_278 = &local_268;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,":","");
          plVar9 = (long *)::std::__cxx11::string::_M_append
                                     ((char *)&local_278,*(ulong *)(p_Var10 + 1));
          psVar1 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_2c0.field_2._M_allocated_capacity = *psVar1;
            local_2c0.field_2._8_8_ = plVar9[3];
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *psVar1;
            local_2c0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2c0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar1;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if (local_278 != &local_268) {
            operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
          }
        }
        if (*(long *)(p_Var10 + 4) != 0) {
          local_1e0 = (ordered_dict<tinyusdz::Relationship> *)(p_Var10 + 2);
          lVar12 = 8;
          idx = 0;
          local_1e8 = p_Var10;
          do {
            this_00 = local_1e0;
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            pbVar5 = (local_1e0->_keys).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar6 = *(long *)((long)pbVar5 + lVar12 + -8);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c0,lVar6,
                       *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar12) + lVar6);
            local_238 = (Relationship *)0x0;
            bVar8 = ordered_dict<tinyusdz::Relationship>::at(this_00,idx,&local_238);
            if (bVar8) {
              local_278 = &local_268;
              local_270 = 0;
              local_268 = 0;
              if (local_2c0._M_string_length == 0) {
                ::std::operator+(&local_258,"material:binding:collection",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_298);
                ::std::__cxx11::string::operator=((string *)&local_278,(string *)&local_258);
                p_Var10 = local_1e8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                  p_Var10 = local_1e8;
                }
              }
              else {
                local_1d8[0] = local_1c8;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,":","");
                plVar11 = (long *)::std::__cxx11::string::replace
                                            ((ulong)local_1d8,0,(char *)0x0,0x42e239);
                local_210 = &local_200;
                plVar9 = plVar11 + 2;
                if ((long *)*plVar11 == plVar9) {
                  local_200 = *plVar9;
                  lStack_1f8 = plVar11[3];
                }
                else {
                  local_200 = *plVar9;
                  local_210 = (long *)*plVar11;
                }
                local_208 = plVar11[1];
                *plVar11 = (long)plVar9;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_210,(ulong)local_2c0._M_dataplus._M_p);
                local_230 = &local_220;
                plVar9 = plVar11 + 2;
                if ((long *)*plVar11 == plVar9) {
                  local_220 = *plVar9;
                  lStack_218 = plVar11[3];
                }
                else {
                  local_220 = *plVar9;
                  local_230 = (long *)*plVar11;
                }
                local_228 = plVar11[1];
                *plVar11 = (long)plVar9;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar9 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)&local_230,(ulong)local_298._M_dataplus._M_p);
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                psVar3 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar3) {
                  local_258.field_2._M_allocated_capacity = *psVar3;
                  local_258.field_2._8_8_ = plVar9[3];
                }
                else {
                  local_258.field_2._M_allocated_capacity = *psVar3;
                  local_258._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_258._M_string_length = plVar9[1];
                *plVar9 = (long)psVar3;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)&local_278,(string *)&local_258);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                if (local_230 != &local_220) {
                  operator_delete(local_230,local_220 + 1);
                }
                if (local_210 != &local_200) {
                  operator_delete(local_210,local_200 + 1);
                }
                if (local_1d8[0] != local_1c8) {
                  operator_delete(local_1d8[0],local_1c8[0] + 1);
                }
              }
              local_230 = (long *)CONCAT44(local_230._4_4_,local_238->listOpQual);
              anon_unknown_173::print_relationship
                        ((string *)&local_258,local_238,(ListEditQual *)&local_230,
                         SUB81((string *)&local_278,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              if (local_278 != &local_268) {
                operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            idx = idx + 1;
            lVar12 = lVar12 + 0x20;
          } while (idx < *(ulong *)(p_Var10 + 4));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != local_2a0);
    }
    __return_storage_ptr__ = local_1f0;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_material_binding(const MaterialBinding *mb, const uint32_t indent) {
  if (!mb) {
    return std::string();
  }

  std::stringstream ss;

  if (mb->materialBinding) {
    ss << print_relationship(mb->materialBinding.value(),
                             mb->materialBinding.value().get_listedit_qual(),
                             /* custom */ false, kMaterialBinding, indent);
  }

  if (mb->materialBindingPreview) {
    ss << print_relationship(
        mb->materialBindingPreview.value(),
        mb->materialBindingPreview.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingPreview, indent);
  }

  if (mb->materialBindingFull) {
    ss << print_relationship(
        mb->materialBindingFull.value(),
        mb->materialBindingFull.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingFull, indent);
  }

  // NOTE: matb does not include "material:binding", "material:binding:preview" and "material:binding:full"
  for (const auto &matb : mb->materialBindingMap()) {
    if (matb.first.empty()) {
      // this should not happen
      continue;
    }

    std::string matb_name = kMaterialBinding + std::string(":") + matb.first;

    ss << print_relationship(
        matb.second,
        matb.second.get_listedit_qual(),
        /* custom */ false, matb_name, indent);
    
  }

  // TODO: sort by collection name?
  for (const auto &collection : mb->materialBindingCollectionMap()) {

    std::string purpose_name;
    if (!collection.first.empty()) {
      purpose_name = std::string(":") + collection.first;
    }

    for (size_t i = 0; i < collection.second.size(); i++) {
      std::string coll_name = collection.second.keys()[i];
 
      const Relationship *rel{nullptr};
      if (!collection.second.at(i, &rel)) {
        // this should not happen though.
        continue;
      }

      std::string rel_name;

      if (coll_name.empty()) { 
        rel_name = kMaterialBindingCollection + purpose_name;
      } else {
        rel_name = kMaterialBindingCollection + std::string(":") + coll_name + purpose_name;
      }

      ss << print_relationship(
          *rel,
          rel->get_listedit_qual(),
          /* custom */ false, rel_name, indent);
    }
  }

  return ss.str();
}